

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  sqlite3 *db_00;
  int iVar1;
  Expr *pEVar2;
  sqlite3 *db;
  Expr ifNullRow;
  Expr *pCopy;
  Expr *pNew;
  Expr *pExpr_local;
  SubstContext *pSubst_local;
  
  if (pExpr == (Expr *)0x0) {
    pSubst_local = (SubstContext *)0x0;
  }
  else {
    if (((pExpr->flags & 1) != 0) && ((int)pExpr->iRightJoinTable == pSubst->iTable)) {
      pExpr->iRightJoinTable = (i16)pSubst->iNewTable;
    }
    pNew = pExpr;
    if ((pExpr->op == 0x98) && (pExpr->iTable == pSubst->iTable)) {
      if (pExpr->iColumn < 0) {
        pExpr->op = 'e';
      }
      else {
        ifNullRow.pTab = (Table *)pSubst->pEList->a[pExpr->iColumn].pExpr;
        iVar1 = sqlite3ExprIsVector((Expr *)ifNullRow.pTab);
        if (iVar1 == 0) {
          db_00 = pSubst->pParse->db;
          if ((pSubst->isLeftJoin != 0) && (*(char *)&(ifNullRow.pTab)->zName != -0x68)) {
            memset(&db,0,0x48);
            db._0_1_ = 0xa0;
            ifNullRow.u.zToken = (char *)ifNullRow.pTab;
            ifNullRow.x._4_4_ = pSubst->iNewTable;
            ifNullRow.pTab = (Table *)&db;
          }
          pNew = sqlite3ExprDup(db_00,(Expr *)ifNullRow.pTab,0);
          if ((pNew != (Expr *)0x0) && (pSubst->isLeftJoin != 0)) {
            pNew->flags = pNew->flags | 0x100000;
          }
          if ((pNew != (Expr *)0x0) && ((pExpr->flags & 1) != 0)) {
            pNew->iRightJoinTable = pExpr->iRightJoinTable;
            pNew->flags = pNew->flags | 1;
          }
          sqlite3ExprDelete(db_00,pExpr);
        }
        else {
          sqlite3VectorErrorMsg(pSubst->pParse,(Expr *)ifNullRow.pTab);
        }
      }
    }
    else {
      if ((pExpr->op == 0xa0) && (pExpr->iTable == pSubst->iTable)) {
        pExpr->iTable = pSubst->iNewTable;
      }
      pEVar2 = substExpr(pSubst,pExpr->pLeft);
      pExpr->pLeft = pEVar2;
      pEVar2 = substExpr(pSubst,pExpr->pRight);
      pExpr->pRight = pEVar2;
      if ((pExpr->flags & 0x800) == 0) {
        substExprList(pSubst,(pExpr->x).pList);
      }
      else {
        substSelect(pSubst,(pExpr->x).pSelect,1);
      }
    }
    pSubst_local = (SubstContext *)pNew;
  }
  return (Expr *)pSubst_local;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_FromJoin) && pExpr->iRightJoinTable==pSubst->iTable ){
    pExpr->iRightJoinTable = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN && pExpr->iTable==pSubst->iTable ){
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else{
      Expr *pNew;
      Expr *pCopy = pSubst->pEList->a[pExpr->iColumn].pExpr;
      Expr ifNullRow;
      assert( pSubst->pEList!=0 && pExpr->iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pLeft==0 && pExpr->pRight==0 );
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isLeftJoin && pCopy->op!=TK_COLUMN ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          pCopy = &ifNullRow;
        }
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( pNew && pSubst->isLeftJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( pNew && ExprHasProperty(pExpr,EP_FromJoin) ){
          pNew->iRightJoinTable = pExpr->iRightJoinTable;
          ExprSetProperty(pNew, EP_FromJoin);
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
  }
  return pExpr;
}